

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  long lVar4;
  ushort uVar5;
  char *pcVar6;
  double dVar7;
  bitset<16UL> local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  dVar7 = testKalmanFilter();
  bVar1 = 0.1 <= dVar7;
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Test Kalman filter FAILED: estimationError = ",0x2d);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Test Kalman filter SUCCEEDED: estimationError = ",0x30);
  }
  uVar5 = (ushort)bVar1;
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  dVar7 = testKalmanFilterZeroInput();
  if (0.1 <= dVar7) {
    uVar5 = bVar1 | 2;
    pcVar6 = "Test Kalman filter (zero input) FAILED: estimationError = ";
    lVar4 = 0x3a;
  }
  else {
    pcVar6 = "Test Kalman filter (zero input) SUCCEEDED: estimationError = ";
    lVar4 = 0x3d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  dVar7 = testExtendedKalmanFilter();
  if (0.1 <= dVar7) {
    uVar5 = uVar5 | 4;
    pcVar6 = "Test extended Kalman filter FAILED: estimationError = ";
    lVar4 = 0x36;
  }
  else {
    pcVar6 = "Test extended Kalman filter SUCCEEDED: estimationError = ";
    lVar4 = 0x39;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  dVar7 = testExtendedKalmanFilterLTV();
  if (0.1 <= dVar7) {
    uVar5 = uVar5 | 8;
    pcVar6 = "Test extended Kalman filter (LTV) FAILED: estimationError = ";
    lVar4 = 0x3c;
  }
  else {
    pcVar6 = "Test extended Kalman filter (LTV) SUCCEEDED: estimationError = ";
    lVar4 = 0x3f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  dVar7 = testExtendedKalmanFilterZeroInput();
  if (0.1 <= dVar7) {
    uVar5 = uVar5 | 0x10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Test extended Kalman filter (zero input) FAILED: estimationError = ",0x43);
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Test extended Kalman filter (zero input) SUCCEEDED: estimationError = ",0x46);
    poVar2 = std::ostream::_M_insert<double>(dVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test exit code ",0xf);
  local_20.super__Base_bitset<1UL>._M_w._2_6_ = 0;
  local_20.super__Base_bitset<1UL>._M_w._0_2_ = uVar5;
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_20);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
  std::ostream::put((char)pbVar3);
  std::ostream::flush();
  return (int)uVar5;
}

Assistant:

int main()
{
    short exit=0;
    double error;
    std::cout<<"Starting"<<std::endl;

    if ((error=testKalmanFilter())<0.1)
    {
        std::cout<<"Test Kalman filter SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 1 );
        std::cout<<"Test Kalman filter FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testKalmanFilterZeroInput())<0.1)
    {
        std::cout<<"Test Kalman filter (zero input) SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 10 );
        std::cout<<"Test Kalman filter (zero input) FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testExtendedKalmanFilter())<0.1)
    {
        std::cout<<"Test extended Kalman filter SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 100 );
        std::cout<<"Test extended Kalman filter FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testExtendedKalmanFilterLTV())<0.1)
    {
        std::cout<<"Test extended Kalman filter (LTV) SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 1000 );
        std::cout<<"Test extended Kalman filter (LTV) FAILED: estimationError = "<<error<<std::endl;
    }
    if ((error=testExtendedKalmanFilterZeroInput())<0.1)
    {
        std::cout<<"Test extended Kalman filter (zero input) SUCCEEDED: estimationError = "<<error<<std::endl;
    }
    else
    {
        exit=exit | BOOST_BINARY( 10000 );
        std::cout<<"Test extended Kalman filter (zero input) FAILED: estimationError = "<<error<<std::endl<<std::endl;
    }


    std::cout<<"Test exit code "<< std::bitset< 16 >(exit) <<std::endl;

    return exit;

}